

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.cpp
# Opt level: O2

pair<int,_int> Utils::FindMax(Matrix *m,int start)

{
  int iVar1;
  uint uVar2;
  uint j;
  ulong uVar3;
  int i;
  uint i_00;
  double dVar4;
  undefined8 local_48;
  
  iVar1 = Matrix::GetCols(m);
  local_48 = Matrix::operator()(m,start,start);
  local_48 = ABS(local_48);
  uVar3 = (ulong)(uint)start;
  uVar2 = start;
  for (i_00 = start; j = start, (int)i_00 < iVar1; i_00 = i_00 + 1) {
    for (; (int)j < iVar1; j = j + 1) {
      dVar4 = Matrix::operator()(m,i_00,j);
      if (local_48 < ABS(dVar4)) {
        uVar3 = (ulong)j;
        local_48 = ABS(dVar4);
        uVar2 = i_00;
      }
    }
  }
  return (pair<int,_int>)((ulong)uVar2 | uVar3 << 0x20);
}

Assistant:

std::pair<int, int> Utils::FindMax(const Matrix& m, int start)
{
    const int n = m.GetCols();
    double max = std::abs(m(start, start));
    std::pair<int, int> indexes = {start, start};

    for (int i = start; i < n; ++i)
    {
        for (int j = start; j < n; ++j)
        {
            const double curr = std::abs(m(i, j));
            if (curr > max)
            {
                max = curr;
                indexes = {i, j};
            }
        }
    }
    return indexes;
}